

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorhulls.cpp
# Opt level: O1

ImVec2 VHRotateV(ImVec2 v,double theta)

{
  ImVec2 IVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined4 uStack_54;
  
  dVar2 = cos(theta);
  uStack_54 = v.y;
  dVar3 = sin(theta);
  dVar4 = sin(theta);
  dVar5 = cos(theta);
  IVar1.y = (float)(dVar4 * (double)v.x + dVar5 * (double)uStack_54);
  IVar1.x = (float)(dVar2 * (double)v.x + -dVar3 * (double)uStack_54);
  return IVar1;
}

Assistant:

ImVec2 VHRotateV(ImVec2 v, double theta) {
	double nx, ny;

	nx = v.x * cos(theta) - v.y * sin(theta);
	ny = v.x * sin(theta) + v.y * cos(theta);

	return ImVec2(nx, ny);
}